

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlanningUnitMADPDiscrete.cpp
# Opt level: O2

Index __thiscall
PlanningUnitMADPDiscrete::GetJointActionObservationHistoryIndex
          (PlanningUnitMADPDiscrete *this,Index t,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *Jactions,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *Jobservations,Scope *agentSope)

{
  Index IVar1;
  const_reference pvVar2;
  size_t nrA;
  size_t nrO;
  const_reference pvVar3;
  Index ts;
  size_type __n;
  PlanningUnitMADPDiscrete *this_00;
  ulong __n_00;
  vector<unsigned_int,_std::allocator<unsigned_int>_> JAO_Is;
  allocator_type local_65;
  Index local_64;
  PlanningUnitMADPDiscrete *local_60;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_58;
  value_type_conflict1 local_4c;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_48;
  
  __n_00 = (ulong)t;
  local_64 = t;
  local_58 = Jobservations;
  pvVar2 = std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::at
                     (&this->_m_firstJAOHIforT,__n_00);
  local_60 = (PlanningUnitMADPDiscrete *)*pvVar2;
  nrA = (**(code **)((long)*this->_m_madp + 0x68))();
  nrO = (**(code **)((long)*this->_m_madp + 200))();
  local_4c = 0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_48,__n_00,&local_4c,
             &local_65);
  for (__n = 0; __n_00 != __n; __n = __n + 1) {
    pvVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::at(Jactions,__n);
    IVar1 = *pvVar3;
    pvVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::at(local_58,__n);
    IVar1 = IndexTools::ActionAndObservation_to_ActionObservationIndex(IVar1,*pvVar3,nrA,nrO);
    local_48._M_impl.super__Vector_impl_data._M_start[__n] = IVar1;
  }
  this_00 = local_60;
  IVar1 = Globals::CastLIndexToIndex((LIndex)local_60);
  IVar1 = ComputeHistoryIndex(this_00,local_64,IVar1,
                              local_48._M_impl.super__Vector_impl_data._M_start,nrO * nrA);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_48);
  return IVar1;
}

Assistant:

Index PlanningUnitMADPDiscrete::GetJointActionObservationHistoryIndex(
        Index t, 
        const vector<Index>& Jactions,
        const vector<Index>& Jobservations,
        const Scope& agentSope
        ) const
{
    //functioning is the same as for observation histories:
    //(only now the base is the nr AO)

    LIndex first_JAOHI=_m_firstJAOHIforT.at(t);
    size_t nrJA = GetNrJointActions();
    size_t nrJO = GetNrJointObservations();
    size_t nrJAO = nrJA * nrJO;
 
    vector<Index> JAO_Is(t, 0);
    for (Index ts=0; ts<t; ts++)
        JAO_Is[ts] = IndexTools::ActionAndObservation_to_ActionObservationIndex(
                    Jactions.at(ts), Jobservations.at(ts), nrJA, nrJO);
    return( ComputeHistoryIndex(
                t, 
                CastLIndexToIndex(first_JAOHI),
                &JAO_Is[0],
                nrJAO
                )
          );    
}